

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_readwrite(connectdata *conn,SessionHandle *data,_Bool *done)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  Curl_handler *pCVar7;
  void *pvVar8;
  curl_off_t *pcVar9;
  curl_off_t cVar10;
  _Bool _Var11;
  uint uVar12;
  CURLcode CVar13;
  CHUNKcode code;
  anon_enum_32 aVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  size_t sVar21;
  size_t len;
  curl_socket_t writefd;
  size_t sVar22;
  uint uVar23;
  uint uVar24;
  curl_socket_t readfd0;
  uint uVar25;
  bool bVar26;
  timeval tVar27;
  _Bool local_51;
  ssize_t bytes_written;
  _Bool readmore;
  _Bool *local_40;
  long local_38;
  
  uVar23 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar12 = (data->req).keepon;
  writefd = -1;
  readfd0 = -1;
  if ((uVar12 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar12 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar23 = uVar23 | (conn->data->state).drain != 0;
  if (uVar23 == 0) {
    uVar23 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar23 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  uVar12 = (data->req).keepon;
  uVar25 = 0;
  if (((uVar12 & 1) != 0) &&
     (((uVar23 & 1) != 0 || (uVar25 = 0, (conn->bits).stream_was_rewound == true)))) {
    _readmore = _readmore & 0xffffff00;
    *done = false;
    uVar25 = 0;
    local_38 = 0;
    local_40 = done;
LAB_004d3c9c:
    sVar21 = (data->set).buffer_size;
    if (sVar21 == 0) {
      sVar21 = 0x4000;
    }
    lVar20 = (data->req).size;
    if ((lVar20 == -1) || ((data->req).header != false)) {
LAB_004d3cdc:
      CVar13 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar21,&bytes_written);
      if (CVar13 != CURLE_OK) {
        if (CVar13 != CURLE_AGAIN) {
          return CVar13;
        }
        goto LAB_004d434e;
      }
      lVar16 = (data->req).bytecount;
    }
    else {
      lVar16 = (data->req).bytecount;
      sVar22 = lVar20 - lVar16;
      if ((long)sVar22 < (long)sVar21) {
        sVar21 = sVar22;
      }
      if (sVar21 != 0) goto LAB_004d3cdc;
      bytes_written = 0;
    }
    if (((lVar16 == 0) && ((data->req).writebytecount == 0)) &&
       (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
      tVar27 = curlx_tvnow();
      (data->req).start100 = tVar27;
    }
    if (bytes_written == 0) {
      bVar26 = (data->req).bodywrites == 0;
    }
    else {
      bVar26 = false;
    }
    if (0 < bytes_written || bVar26) {
      (data->req).buf[bytes_written] = '\0';
      (data->req).str = (data->req).buf;
      p_Var6 = conn->handler->readwrite;
      if (p_Var6 != (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar13 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        if (readmore != false) goto LAB_004d4348;
      }
      if ((data->req).header == true) {
        local_51 = false;
        CVar13 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_51);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        p_Var6 = conn->handler->readwrite;
        if (((p_Var6 != (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                        0x0) && ((data->req).maxdownload < 1)) && (0 < bytes_written)) {
          CVar13 = (*p_Var6)(data,conn,&bytes_written,&readmore);
          if (CVar13 != CURLE_OK) {
            return CVar13;
          }
          if (readmore != false) goto LAB_004d4348;
        }
        if (local_51 == true) {
          if (0 < bytes_written) {
            _Var11 = Curl_pipeline_wanted(conn->data->multi,1);
            pcVar17 = (data->state).path;
            if (_Var11) {
              Curl_infof(data,"Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                         bytes_written,pcVar17);
              conn->read_pos = conn->read_pos - bytes_written;
              (conn->bits).stream_was_rewound = true;
            }
            else {
              Curl_infof(data,
                         "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                         ,bytes_written,pcVar17);
            }
          }
          goto LAB_004d4348;
        }
      }
      if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
         (0 < bytes_written || bVar26)) {
        if (((data->req).bodywrites == 0 && !bVar26) && ((conn->handler->protocol & 0x40003) != 0))
        {
          if ((data->req).newurl == (char *)0x0) {
LAB_004d3eb3:
            lVar20 = (data->state).resume_from;
            if ((((lVar20 == 0) || ((data->req).content_range != false)) ||
                ((data->set).httpreq != HTTPREQ_GET)) || ((data->req).ignorebody != false)) {
              if ((((data->set).timecondition == CURL_TIMECOND_NONE) ||
                  ((data->state).range != (char *)0x0)) ||
                 (_Var11 = Curl_meets_timecondition(data,(data->req).timeofdoc), done = local_40,
                 _Var11)) goto LAB_004d3f08;
              *local_40 = true;
              (data->info).httpcode = 0x130;
              Curl_infof(data,"Simulate a HTTP 304 response!\n");
              (conn->bits).close = true;
            }
            else {
              if ((data->req).size != lVar20) {
                Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
                return CURLE_RANGE_ERROR;
              }
              Curl_infof(data,"The entire document is already downloaded");
              (conn->bits).close = true;
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              *local_40 = true;
              done = local_40;
            }
          }
          else {
            if ((conn->bits).close != true) {
              (data->req).ignorebody = true;
              Curl_infof(data,"Ignoring the response-body\n");
              goto LAB_004d3eb3;
            }
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            *local_40 = true;
            done = local_40;
          }
          uVar25 = 1;
          goto LAB_004d438a;
        }
LAB_004d3f08:
        plVar3 = &(data->req).bodywrites;
        *plVar3 = *plVar3 + 1;
        if (((data->set).verbose == true) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen,conn),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
        }
        if ((data->req).chunk == true) {
          code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar17 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar17);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if (code == CHUNKE_STOP) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            sVar21 = (conn->chunk).dataleft;
            if (sVar21 != 0) {
              Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar21);
              _Var11 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var11) {
                Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar21);
                conn->read_pos = conn->read_pos - sVar21;
                (conn->bits).stream_was_rewound = true;
              }
            }
          }
        }
        if ((data->req).badheader == HEADER_NORMAL) {
          lVar20 = (data->req).bytecount;
        }
        else {
          lVar20 = (data->req).bytecount;
          if ((data->req).ignorebody == false) {
            lVar20 = lVar20 + (data->req).hbuflen;
            (data->req).bytecount = lVar20;
          }
        }
        lVar16 = (data->req).maxdownload;
        if (lVar16 != -1) {
          lVar18 = (bytes_written + lVar20) - lVar16;
          if (lVar16 <= bytes_written + lVar20) {
            if ((lVar18 != 0) && ((data->req).ignorebody == false)) {
              _Var11 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var11) {
                Curl_infof(data,
                           "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                           ,lVar18,(data->state).path,(data->req).size,(data->req).maxdownload,
                           (data->req).bytecount,bytes_written);
                conn->read_pos = conn->read_pos - lVar18;
                (conn->bits).stream_was_rewound = true;
              }
              else {
                Curl_infof(data,
                           "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                           ,lVar18,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
              }
            }
            lVar20 = (data->req).bytecount;
            bytes_written = (data->req).maxdownload - lVar20;
            if (bytes_written < 1) {
              bytes_written = 0;
            }
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            local_38 = lVar18;
          }
        }
        (data->req).bytecount = lVar20 + bytes_written;
        Curl_pgrsSetDownloadCounter(data,lVar20 + bytes_written);
        if (((data->req).chunk != false) ||
           (aVar14 = (data->req).badheader,
           (aVar14 == HEADER_NORMAL && bytes_written == 0) && !bVar26)) goto LAB_004d4225;
        bVar19 = (data->req).ignorebody;
        if (aVar14 == HEADER_NORMAL) {
LAB_004d41cf:
          if ((bVar19 & 1) == 0) {
            pcVar17 = (data->req).str;
            if ((conn->handler->protocol & 0xc000) == 0) {
              CVar13 = Curl_client_write(conn,1,pcVar17,bytes_written);
            }
            else {
              CVar13 = Curl_pop3_write(conn,pcVar17,bytes_written);
            }
            (data->req).badheader = HEADER_NORMAL;
            if (CVar13 != CURLE_OK) {
              return CVar13;
            }
            goto LAB_004d4225;
          }
        }
        else {
          if ((bVar19 & 1) == 0) {
            sVar21 = (data->req).maxdownload;
            sVar22 = (data->req).hbuflen;
            len = sVar21;
            if ((long)sVar22 < (long)sVar21) {
              len = sVar22;
            }
            if (sVar21 == 0xffffffffffffffff) {
              len = sVar22;
            }
            CVar13 = Curl_client_write(conn,1,(data->state).headerbuff,len);
            if (CVar13 != CURLE_OK) {
              return CVar13;
            }
            aVar14 = (data->req).badheader;
          }
          if (aVar14 < HEADER_ALLBAD) {
            bVar19 = (data->req).ignorebody;
            goto LAB_004d41cf;
          }
        }
        (data->req).badheader = HEADER_NORMAL;
      }
LAB_004d4225:
      pCVar7 = conn->handler;
      p_Var6 = pCVar7->readwrite;
      if (((p_Var6 != (_func_CURLcode_SessionHandle_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
          && (local_38 != 0)) && ((conn->bits).stream_was_rewound == false)) {
        ppcVar4 = &(data->req).str;
        *ppcVar4 = *ppcVar4 + bytes_written;
        bytes_written = local_38;
        CVar13 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        uVar25 = 1;
        if (readmore == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 | 1;
        }
        goto LAB_004d434e;
      }
      if (bVar26) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
      }
      uVar25 = 1;
      if ((pCVar7->protocol & 0x30) == 0) goto LAB_004d434e;
      goto LAB_004d3c9c;
    }
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
LAB_004d4348:
    uVar25 = 1;
LAB_004d434e:
    done = local_40;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_004d438a:
    if (*done != false) {
      return CURLE_OK;
    }
    uVar12 = (data->req).keepon;
  }
  uVar24 = uVar25;
  if ((uVar23 & uVar12 & 2) == 0) goto LAB_004d43c2;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar24 = uVar25 | 2;
  if ((data->req).upload_present != 0) {
LAB_004d3b96:
    CVar13 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                        (data->req).upload_present,&bytes_written);
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
    }
    lVar20 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar20;
    if (lVar20 == (data->state).infilesize) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar20 = (data->req).upload_present - bytes_written;
    if (lVar20 == 0) {
      (data->req).upload_fromhere = (data->req).uploadbuf;
      (data->req).upload_present = 0;
      if ((data->req).upload_done == true) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      }
    }
    else {
      (data->req).upload_present = lVar20;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
    goto LAB_004d43c2;
  }
  (data->req).upload_fromhere = (data->req).uploadbuf;
  if ((data->req).upload_done == false) {
    pvVar8 = (data->req).protop;
    if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar8 + 0x78) == 2)) {
      (data->req).exp100 = EXP100_AWAITING_CONTINUE;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
      tVar27 = curlx_tvnow();
      (data->req).start100 = tVar27;
      Curl_expire(data,(data->set).expect_100_timeout);
      uVar24 = uVar25;
      goto LAB_004d43c2;
    }
    if ((conn->handler->protocol & 0x40003) == 0) {
      bVar26 = false;
    }
    else {
      bVar26 = *(int *)((long)pvVar8 + 0x78) == 1;
    }
    CVar13 = Curl_fillreadbuffer(conn,0x4000,(int *)&readmore);
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    lVar20 = (long)(int)_readmore;
    if (lVar20 == 0) goto LAB_004d4283;
    if (0 < (int)_readmore) {
      (data->req).upload_present = lVar20;
      if ((!bVar26) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar17 = (char *)(*Curl_cmalloc)(0x8000);
          (data->state).scratch = pcVar17;
          if (pcVar17 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        lVar18 = 0;
        lVar16 = 0;
        do {
          cVar5 = (data->req).upload_fromhere[lVar18];
          pcVar17 = (data->state).scratch;
          if (cVar5 == '\n') {
            lVar1 = lVar16 + 1;
            pcVar17[lVar16] = '\r';
            (data->state).scratch[lVar16 + 1] = '\n';
            lVar16 = lVar1;
            if ((data->set).crlf == false) {
              pcVar9 = &(data->state).infilesize;
              *pcVar9 = *pcVar9 + 1;
            }
          }
          else {
            pcVar17[lVar16] = cVar5;
          }
          lVar18 = lVar18 + 1;
          lVar16 = lVar16 + 1;
        } while (lVar20 != lVar18);
        if (lVar16 != lVar20) {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = lVar16;
          lVar20 = lVar16;
        }
      }
      if (((conn->handler->protocol & 0x30000) != 0) &&
         (CVar13 = Curl_smtp_escape_eob(conn,lVar20), CVar13 != CURLE_OK)) {
        return CVar13;
      }
      goto LAB_004d3b96;
    }
    uVar23 = (data->req).keepon;
  }
  else {
LAB_004d4283:
    uVar23 = (data->req).keepon;
    if ((uVar23 & 0x20) != 0) goto LAB_004d43c2;
  }
  (data->req).keepon = uVar23 & 0xfffffffd;
  if (((conn->bits).rewindaftersend == true) && (CVar13 = Curl_readrewind(conn), CVar13 != CURLE_OK)
     ) {
    return CVar13;
  }
LAB_004d43c2:
  tVar27 = curlx_tvnow();
  (data->req).now = tVar27;
  if (uVar24 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (lVar20 = curlx_tvdiff(tVar27,(data->req).start100), (data->set).expect_100_timeout <= lVar20
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar9 = (data->req).bytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).bytecount;
    }
    pcVar9 = (data->req).writebytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).writebytecount;
    }
  }
  iVar15 = Curl_pgrsUpdate(conn);
  if (iVar15 == 0) {
    CVar13 = Curl_speedcheck(data,(data->req).now);
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar20 = (data->req).size;
        if ((((lVar20 != -1) && (lVar16 = (data->req).bytecount, lVar20 != lVar16)) &&
            (lVar16 != lVar20 + (data->state).crlf_conversions)) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar15 = Curl_pgrsUpdate(conn);
      if (iVar15 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      lVar20 = Curl_timeleft(data,&(data->req).now,false);
      if (lVar20 < 0) {
        lVar20 = (data->req).size;
        lVar16 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
        cVar10 = (data->req).bytecount;
        if (lVar20 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     lVar16,cVar10);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,lVar16,cVar10,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct SessionHandle *data,
                        bool *done)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_ready(fd_read, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      long ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}